

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3CursorSeekStmt(Fts3Cursor *pCsr)

{
  sqlite3_vtab *psVar1;
  int iVar2;
  char *zSql;
  
  if (pCsr->pStmt != (sqlite3_stmt *)0x0) {
    return 0;
  }
  psVar1 = (pCsr->base).pVtab;
  if ((sqlite3_stmt *)psVar1[0x11].zErrMsg == (sqlite3_stmt *)0x0) {
    zSql = sqlite3_mprintf("SELECT %s WHERE rowid = ?",psVar1[0x12].pModule);
    if (zSql == (char *)0x0) {
      return 7;
    }
    iVar2 = sqlite3LockAndPrepare
                      ((sqlite3 *)psVar1[1].pModule,zSql,-1,0x81,(Vdbe *)0x0,&pCsr->pStmt,
                       (char **)0x0);
    sqlite3_free(zSql);
    if (iVar2 != 0) {
      return iVar2;
    }
  }
  else {
    pCsr->pStmt = (sqlite3_stmt *)psVar1[0x11].zErrMsg;
    psVar1[0x11].zErrMsg = (char *)0x0;
  }
  pCsr->bSeekStmt = '\x01';
  return 0;
}

Assistant:

static int fts3CursorSeekStmt(Fts3Cursor *pCsr){
  int rc = SQLITE_OK;
  if( pCsr->pStmt==0 ){
    Fts3Table *p = (Fts3Table *)pCsr->base.pVtab;
    char *zSql;
    if( p->pSeekStmt ){
      pCsr->pStmt = p->pSeekStmt;
      p->pSeekStmt = 0;
    }else{
      zSql = sqlite3_mprintf("SELECT %s WHERE rowid = ?", p->zReadExprlist);
      if( !zSql ) return SQLITE_NOMEM;
      rc = sqlite3_prepare_v3(p->db, zSql,-1,SQLITE_PREPARE_PERSISTENT,&pCsr->pStmt,0);
      sqlite3_free(zSql);
    }
    if( rc==SQLITE_OK ) pCsr->bSeekStmt = 1;
  }
  return rc;
}